

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O1

int Aig_ManCleanup(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint *__ptr;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar5 = malloc(800);
  *(void **)(__ptr + 2) = pvVar5;
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar5 = pVVar6->pArray[lVar9];
      if (((pvVar5 != (void *)0x0) && (*(uint *)((long)pvVar5 + 0x18) < 0x40)) &&
         ((*(uint *)((long)pvVar5 + 0x18) & 7) - 5 < 2)) {
        uVar3 = __ptr[1];
        uVar4 = *__ptr;
        if (uVar3 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar8 = 0x10;
          }
          else {
            uVar8 = uVar4 * 2;
            if ((int)uVar8 <= (int)uVar4) goto LAB_0062cc84;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc((ulong)uVar4 << 4);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),(ulong)uVar4 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = uVar8;
        }
LAB_0062cc84:
        __ptr[1] = uVar3 + 1;
        *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar3 * 8) = pvVar5;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = p->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  uVar3 = __ptr[1];
  if (0 < (long)(int)uVar3) {
    lVar9 = *(long *)(__ptr + 2);
    lVar10 = 0;
    do {
      Aig_ObjDelete_rec(p,*(Aig_Obj_t **)(lVar9 + lVar10 * 8),1);
      lVar10 = lVar10 + 1;
    } while ((int)uVar3 != lVar10);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return (iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6]);
}

Assistant:

int Aig_ManCleanup( Aig_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Aig_Obj_t * pNode;
    int i, nNodesOld = Aig_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Aig_ManForEachObj( p, pNode, i )
        if ( Aig_ObjIsNode(pNode) && Aig_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pNode, i )
        Aig_ObjDelete_rec( p, pNode, 1 );
    Vec_PtrFree( vObjs );
    return nNodesOld - Aig_ManNodeNum(p);
}